

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFReader.cpp
# Opt level: O0

vector<int,_std::allocator<int>_> *
ZXing::Pdf417::ReadCodeWords<ZXing::PointT<double>>
          (BitMatrixCursor<ZXing::PointT<double>_> topCur,SymbolInfo info)

{
  PointT<double> o;
  int iVar1;
  double dVar2;
  BitMatrixCursor<ZXing::PointT<double>_> *this;
  CodeWord CVar3;
  reference pvVar4;
  vector<int,_std::allocator<int>_> *in_RDI;
  CodeWord cw_1;
  int col;
  CodeWord cw;
  this_t cur;
  int cluster;
  int row;
  int maxColWidth;
  PointT<double> rowSkip;
  anon_class_1_0_00000001 print;
  vector<int,_std::allocator<int>_> *codeWords;
  PointT<double> *in_stack_fffffffffffffeb8;
  undefined4 in_stack_fffffffffffffec0;
  int in_stack_fffffffffffffec4;
  allocator_type *in_stack_fffffffffffffec8;
  undefined7 in_stack_fffffffffffffed0;
  undefined1 in_stack_fffffffffffffed7;
  bool bVar5;
  size_type in_stack_fffffffffffffed8;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffee0;
  undefined1 *puVar6;
  vector<int,_std::allocator<int>_> *pvVar7;
  undefined1 *puVar8;
  BitMatrixCursor<ZXing::PointT<double>_> *this_00;
  int iStack_b8;
  int local_b4;
  int in_stack_ffffffffffffff74;
  BitMatrixCursor<ZXing::PointT<double>_> *in_stack_ffffffffffffff78;
  int local_64;
  int local_60;
  undefined1 local_4d;
  undefined4 local_4c;
  undefined1 local_45;
  int local_44;
  PointT<double> local_40;
  PointT<double> local_30;
  PointT<double> local_20;
  anon_class_1_0_00000001 local_9 [9];
  
  this_00 = (BitMatrixCursor<ZXing::PointT<double>_> *)&stack0x00000030;
  puVar8 = &stack0x00000008;
  pvVar7 = in_RDI;
  local_20 = BitMatrixCursor<ZXing::PointT<double>_>::right
                       ((BitMatrixCursor<ZXing::PointT<double>_> *)0x2cd83e);
  iStack_b8 = in_stack_fffffffffffffec4;
  if (*(int *)((long)&(this_00->p).y + 4) < *(int *)&(this_00->p).y) {
    local_30 = ZXing::operator*(in_stack_fffffffffffffec4,in_stack_fffffffffffffeb8);
    PointT<double>::operator+=((PointT<double> *)(puVar8 + 8),&local_30);
    local_40 = ZXing::operator-((PointT<double> *)0x2cd8ae);
    local_20 = local_40;
    std::swap<int>((int *)&(this_00->p).y,(int *)((long)&(this_00->p).y + 4));
    iStack_b8 = in_stack_fffffffffffffec4;
  }
  local_44 = (*(int *)((long)&(this_00->d).x + 4) * 3) / 2;
  local_45 = 0;
  dVar2 = (double)(long)(*(int *)&(this_00->p).x * *(int *)((long)&(this_00->p).x + 4));
  local_4c = 0xffffffff;
  puVar6 = &local_4d;
  std::allocator<int>::allocator((allocator<int> *)0x2cd947);
  std::vector<int,_std::allocator<int>_>::vector
            (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,
             (value_type_conflict3 *)CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0),
             in_stack_fffffffffffffec8);
  std::allocator<int>::~allocator((allocator<int> *)0x2cd972);
  local_60 = *(int *)&(this_00->p).y;
  while( true ) {
    iVar1 = local_60;
    local_64 = *(int *)((long)&(this_00->p).y + 4) + 1;
    this = (BitMatrixCursor<ZXing::PointT<double>_> *)std::min<int>((int *)&this_00->p,&local_64);
    if (*(int *)&this->img <= iVar1) break;
    ZXing::operator*(iStack_b8,in_stack_fffffffffffffeb8);
    o.y = (double)puVar6;
    o.x = dVar2;
    BitMatrixCursor<ZXing::PointT<double>_>::movedBy(this,o);
    BitMatrixCursor<ZXing::PointT<double>_>::isWhite
              ((BitMatrixCursor<ZXing::PointT<double>_> *)
               CONCAT44(iStack_b8,in_stack_fffffffffffffec0));
    BitMatrixCursor<ZXing::PointT<double>_>::stepToEdge
              (this_00,(int)((ulong)puVar8 >> 0x20),(int)puVar8,SUB81((ulong)pvVar7 >> 0x38,0));
    CVar3 = ReadCodeWord<ZXing::PointT<double>>(in_stack_ffffffffffffff78,in_stack_ffffffffffffff74)
    ;
    ReadCodeWords<ZXing::PointT<double>_>::anon_class_1_0_00000001::operator()(local_9,CVar3);
    local_b4 = 0;
    while( true ) {
      bVar5 = false;
      if (local_b4 < *(int *)((long)&(this_00->p).x + 4)) {
        bVar5 = BitMatrixCursor<ZXing::PointT<double>_>::isIn
                          ((BitMatrixCursor<ZXing::PointT<double>_> *)
                           CONCAT44(iStack_b8,in_stack_fffffffffffffec0));
      }
      if (bVar5 == false) break;
      CVar3 = ReadCodeWord<ZXing::PointT<double>>
                        (in_stack_ffffffffffffff78,in_stack_ffffffffffffff74);
      iStack_b8 = CVar3.code;
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                         (in_RDI,(long)(local_60 * *(int *)((long)&(this_00->p).x + 4) + local_b4));
      *pvVar4 = iStack_b8;
      ReadCodeWords<ZXing::PointT<double>_>::anon_class_1_0_00000001::operator()(local_9,CVar3);
      local_b4 = local_b4 + 1;
    }
    local_60 = local_60 + 1;
  }
  return pvVar7;
}

Assistant:

std::vector<int> ReadCodeWords(BitMatrixCursor<POINT> topCur, SymbolInfo info)
{
	printf("rows: %d, cols: %d, rowHeight: %.1f, colWidth: %d, firstRow: %d, lastRow: %d, ecLevel: %d\n", info.nRows,
		   info.nCols, info.rowHeight, info.colWidth, info.firstRow, info.lastRow, info.ecLevel);
	auto print = [](CodeWord c [[maybe_unused]]) { printf("%4d.%d ", c.code, c.cluster); };

	auto rowSkip = topCur.right();
	if (info.firstRow > info.lastRow) {
		topCur.p += (info.height - 1) * rowSkip;
		rowSkip = -rowSkip;
		std::swap(info.firstRow, info.lastRow);
	}

	int maxColWidth = info.colWidth * 3 / 2;
	std::vector<int> codeWords(info.nRows * info.nCols, -1);
	for (int row = info.firstRow; row < std::min(info.nRows, info.lastRow + 1); ++row) {
		int cluster = (row % 3) * 3;
		auto cur = topCur.movedBy(int((row - info.firstRow + 0.5f) * info.rowHeight) * rowSkip);
		// skip start pattern
		cur.stepToEdge(8 + cur.isWhite(), maxColWidth);
		// read off left row indicator column
		auto cw [[maybe_unused]] = ReadCodeWord(cur, cluster);
		printf("%3dx%3d:%2d: ", int(cur.p.x), int(cur.p.y), Row(cw));
		print(cw);

		for (int col = 0; col < info.nCols && cur.isIn(); ++col) {
			auto cw = ReadCodeWord(cur, cluster);
			codeWords[row * info.nCols + col] = cw.code;
			print(cw);
		}

#ifdef PRINT_DEBUG
		print(ReadCodeWord(cur));
		printf("\n");
		fflush(stdout);
#endif
	}

	return codeWords;
}